

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.h
# Opt level: O2

void __thiscall pmx::PmxVertexSkinningSDEF::PmxVertexSkinningSDEF(PmxVertexSkinningSDEF *this)

{
  long lVar1;
  
  (this->super_PmxVertexSkinning)._vptr_PmxVertexSkinning = (_func_int **)&PTR_Read_0010dbb8;
  this->bone_index1 = 0;
  this->bone_index2 = 0;
  this->bone_weight = 0.0;
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->sdef_r0 + lVar1) = 0;
    *(undefined4 *)((long)this->sdef_r1 + lVar1) = 0;
    *(undefined4 *)((long)this[1].sdef_c + lVar1 + -0x14) = 0;
  }
  return;
}

Assistant:

PmxVertexSkinningSDEF()
			: bone_index1(0)
			, bone_index2(0)
			, bone_weight(0.0f)
		{
			for (int i = 0; i < 3; ++i) {
				sdef_c[i] = 0.0f;
				sdef_r0[i] = 0.0f;
				sdef_r1[i] = 0.0f;
			}
		}